

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

CoverageBinsSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::CoverageBinsSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::parsing::Token,slang::parsing::Token,slang::syntax::CoverageBinsArraySizeSyntax*,slang::parsing::Token,slang::syntax::CoverageBinInitializerSyntax&,slang::syntax::CoverageIffClauseSyntax*,slang::parsing::Token>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,CoverageBinsArraySizeSyntax **args_4,
          Token *args_5,CoverageBinInitializerSyntax *args_6,CoverageIffClauseSyntax **args_7,
          Token *args_8)

{
  Info *pIVar1;
  Info *pIVar2;
  CoverageBinsArraySizeSyntax *pCVar3;
  CoverageIffClauseSyntax *pCVar4;
  size_t sVar5;
  pointer ppAVar6;
  Info *pIVar7;
  Info *pIVar8;
  Info *pIVar9;
  SyntaxNode *pSVar10;
  undefined4 uVar11;
  TokenKind TVar12;
  undefined1 uVar13;
  NumericTokenFlags NVar14;
  uint32_t uVar15;
  TokenKind TVar16;
  undefined1 uVar17;
  NumericTokenFlags NVar18;
  uint32_t uVar19;
  TokenKind TVar20;
  undefined1 uVar21;
  NumericTokenFlags NVar22;
  uint32_t uVar23;
  TokenKind TVar24;
  undefined1 uVar25;
  NumericTokenFlags NVar26;
  uint32_t uVar27;
  TokenKind TVar28;
  undefined1 uVar29;
  NumericTokenFlags NVar30;
  uint32_t uVar31;
  CoverageBinsSyntax *pCVar32;
  long lVar33;
  
  pCVar32 = (CoverageBinsSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((CoverageBinsSyntax *)this->endPtr < pCVar32 + 1) {
    pCVar32 = (CoverageBinsSyntax *)allocateSlow(this,0xb8,8);
  }
  else {
    this->head->current = (byte *)(pCVar32 + 1);
  }
  TVar12 = args_1->kind;
  uVar13 = args_1->field_0x2;
  NVar14.raw = (args_1->numFlags).raw;
  uVar15 = args_1->rawLen;
  pIVar1 = args_1->info;
  TVar16 = args_2->kind;
  uVar17 = args_2->field_0x2;
  NVar18.raw = (args_2->numFlags).raw;
  uVar19 = args_2->rawLen;
  pIVar2 = args_2->info;
  TVar20 = args_3->kind;
  uVar21 = args_3->field_0x2;
  NVar22.raw = (args_3->numFlags).raw;
  uVar23 = args_3->rawLen;
  pIVar7 = args_3->info;
  pCVar3 = *args_4;
  TVar24 = args_5->kind;
  uVar25 = args_5->field_0x2;
  NVar26.raw = (args_5->numFlags).raw;
  uVar27 = args_5->rawLen;
  pIVar8 = args_5->info;
  pCVar4 = *args_7;
  TVar28 = args_8->kind;
  uVar29 = args_8->field_0x2;
  NVar30.raw = (args_8->numFlags).raw;
  uVar31 = args_8->rawLen;
  pIVar9 = args_8->info;
  (pCVar32->super_MemberSyntax).super_SyntaxNode.kind = CoverageBins;
  (pCVar32->super_MemberSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar32->super_MemberSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  uVar11 = *(undefined4 *)&(args->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar10 = (args->super_SyntaxListBase).super_SyntaxNode.parent;
  (pCVar32->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
       (args->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)
   &(pCVar32->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.field_0x4 =
       uVar11;
  (pCVar32->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent = pSVar10;
  (pCVar32->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.previewNode =
       (args->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (pCVar32->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_005c7548;
  (pCVar32->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
       (args->super_SyntaxListBase).childCount;
  sVar5 = (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
          _M_extent._M_extent_value;
  (pCVar32->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr =
       (args->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>)._M_ptr;
  (pCVar32->super_MemberSyntax).attributes.
  super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar5;
  (pCVar32->super_MemberSyntax).attributes.super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_005c7a10;
  (pCVar32->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
       (SyntaxNode *)pCVar32;
  sVar5 = (pCVar32->super_MemberSyntax).attributes.
          super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
          _M_extent_value;
  if (sVar5 != 0) {
    ppAVar6 = (pCVar32->super_MemberSyntax).attributes.
              super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    lVar33 = 0;
    do {
      *(CoverageBinsSyntax **)(*(long *)((long)ppAVar6 + lVar33) + 8) = pCVar32;
      lVar33 = lVar33 + 8;
    } while (sVar5 << 3 != lVar33);
  }
  (pCVar32->wildcard).kind = TVar12;
  (pCVar32->wildcard).field_0x2 = uVar13;
  (pCVar32->wildcard).numFlags = (NumericTokenFlags)NVar14.raw;
  (pCVar32->wildcard).rawLen = uVar15;
  (pCVar32->wildcard).info = pIVar1;
  (pCVar32->keyword).kind = TVar16;
  (pCVar32->keyword).field_0x2 = uVar17;
  (pCVar32->keyword).numFlags = (NumericTokenFlags)NVar18.raw;
  (pCVar32->keyword).rawLen = uVar19;
  (pCVar32->keyword).info = pIVar2;
  (pCVar32->name).kind = TVar20;
  (pCVar32->name).field_0x2 = uVar21;
  (pCVar32->name).numFlags = (NumericTokenFlags)NVar22.raw;
  (pCVar32->name).rawLen = uVar23;
  (pCVar32->name).info = pIVar7;
  pCVar32->size = pCVar3;
  (pCVar32->equals).kind = TVar24;
  (pCVar32->equals).field_0x2 = uVar25;
  (pCVar32->equals).numFlags = (NumericTokenFlags)NVar26.raw;
  (pCVar32->equals).rawLen = uVar27;
  (pCVar32->equals).info = pIVar8;
  (pCVar32->initializer).ptr = args_6;
  pCVar32->iff = pCVar4;
  (pCVar32->semi).kind = TVar28;
  (pCVar32->semi).field_0x2 = uVar29;
  (pCVar32->semi).numFlags = (NumericTokenFlags)NVar30.raw;
  (pCVar32->semi).rawLen = uVar31;
  (pCVar32->semi).info = pIVar9;
  if (pCVar3 != (CoverageBinsArraySizeSyntax *)0x0) {
    (pCVar3->super_SyntaxNode).parent = (SyntaxNode *)pCVar32;
  }
  (args_6->super_SyntaxNode).parent = (SyntaxNode *)pCVar32;
  if (pCVar4 != (CoverageIffClauseSyntax *)0x0) {
    (pCVar4->super_SyntaxNode).parent = (SyntaxNode *)pCVar32;
  }
  return pCVar32;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }